

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_push(tree *t,char *path,wchar_t filesystem_id,int64_t dev,int64_t ino,restore_time *rt)

{
  int *__s;
  undefined8 in_RCX;
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  archive_string *in_R9;
  tree_entry *te;
  
  __s = (int *)malloc(0x88);
  memset(__s,0,0x88);
  *(undefined8 *)(__s + 2) = *in_RDI;
  *(undefined8 *)(__s + 4) = in_RDI[1];
  if (*(long *)(__s + 4) != 0) {
    *__s = **(int **)(__s + 4) + 1;
  }
  *in_RDI = __s;
  __s[6] = 0;
  __s[7] = 0;
  __s[8] = 0;
  __s[9] = 0;
  __s[10] = 0;
  __s[0xb] = 0;
  __s[0x14] = -1;
  __s[8] = 0;
  __s[9] = 0;
  if (in_RSI != (char *)0x0) {
    strlen(in_RSI);
  }
  archive_strncat(in_R9,__s,(size_t)in_RSI);
  __s[0x12] = 0x38;
  __s[0x13] = in_EDX;
  *(undefined8 *)(__s + 0xe) = in_RCX;
  *(undefined8 *)(__s + 0x10) = in_R8;
  *(undefined8 *)(__s + 0xc) = in_RDI[0xc];
  *(undefined8 *)(__s + 0x16) = *(undefined8 *)(__s + 6);
  if (in_R9 != (archive_string *)0x0) {
    *(size_t *)(__s + 0x18) = in_R9->length;
    *(size_t *)(__s + 0x1a) = in_R9->buffer_length;
    *(char **)(__s + 0x1c) = in_R9[1].s;
    *(size_t *)(__s + 0x1e) = in_R9[1].length;
    __s[0x20] = (int)in_R9[1].buffer_length;
    __s[0x21] = *(int *)((long)&in_R9[1].buffer_length + 4);
  }
  return;
}

Assistant:

static void
tree_push(struct tree *t, const char *path, int filesystem_id,
    int64_t dev, int64_t ino, struct restore_time *rt)
{
	struct tree_entry *te;

	te = malloc(sizeof(*te));
	memset(te, 0, sizeof(*te));
	te->next = t->stack;
	te->parent = t->current;
	if (te->parent)
		te->depth = te->parent->depth + 1;
	t->stack = te;
	archive_string_init(&te->name);
	te->symlink_parent_fd = -1;
	archive_strcpy(&te->name, path);
	te->flags = needsDescent | needsOpen | needsAscent;
	te->filesystem_id = filesystem_id;
	te->dev = dev;
	te->ino = ino;
	te->dirname_length = t->dirname_length;
	te->restore_time.name = te->name.s;
	if (rt != NULL) {
		te->restore_time.mtime = rt->mtime;
		te->restore_time.mtime_nsec = rt->mtime_nsec;
		te->restore_time.atime = rt->atime;
		te->restore_time.atime_nsec = rt->atime_nsec;
		te->restore_time.filetype = rt->filetype;
		te->restore_time.noatime = rt->noatime;
	}
}